

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

ssize_t __thiscall Arcflow::read(Arcflow *this,int __fd,void *__buf,size_t __nbytes)

{
  Arcflow *pAVar1;
  int iVar2;
  int iVar3;
  clock_t cVar4;
  runtime_error *this_00;
  long lVar5;
  long lVar6;
  undefined4 in_register_00000034;
  FILE *fin;
  int nbtypes;
  int label;
  int i_v;
  int i_u;
  Arcflow *local_140;
  char _error_msg_ [256];
  
  fin = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (this->ready == false) {
    cVar4 = clock();
    this->tstart = cVar4;
    Instance::Instance((Instance *)_error_msg_,fin,MVP);
    Instance::operator=(&this->inst,(Instance *)_error_msg_);
    Instance::~Instance((Instance *)_error_msg_);
    iVar2 = __isoc99_fscanf(fin," #GRAPH_BEGIN#");
    if (iVar2 == 0) {
      iVar2 = __isoc99_fscanf(fin," $NBTYPES { %d } ;",&nbtypes);
      if (iVar2 == 1) {
        if (nbtypes == (this->inst).nbtypes) {
          iVar2 = __isoc99_fscanf(fin," $S { %d } ;",&this->S);
          if (iVar2 == 1) {
            local_140 = this;
            std::vector<int,_std::allocator<int>_>::resize(&this->Ts,(long)nbtypes);
            iVar2 = __isoc99_fscanf(fin," $Ts { ");
            if (iVar2 == 0) {
              lVar5 = 0;
              lVar6 = 0;
              do {
                if (nbtypes <= lVar6) {
                  iVar2 = __isoc99_fscanf(fin," } ;");
                  pAVar1 = local_140;
                  if (iVar2 != 0) {
                    snprintf(_error_msg_,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \" } ;\") == 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x24d);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,_error_msg_);
                    goto LAB_0010ac0e;
                  }
                  iVar2 = __isoc99_fscanf(fin," $LOSS { %d } ;",&local_140->LOSS);
                  if (iVar2 != 1) {
                    snprintf(_error_msg_,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \" $LOSS { %d } ;\", &LOSS) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x24f);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,_error_msg_);
                    goto LAB_0010ac0e;
                  }
                  iVar2 = __isoc99_fscanf(fin," $NV { %d } ;",&pAVar1->NV);
                  if (iVar2 != 1) {
                    snprintf(_error_msg_,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \" $NV { %d } ;\", &NV) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x251);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,_error_msg_);
                    goto LAB_0010ac0e;
                  }
                  iVar2 = __isoc99_fscanf(fin," $NA { %d } ;",&pAVar1->NA);
                  if (iVar2 != 1) {
                    snprintf(_error_msg_,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \" $NA { %d } ;\", &NA) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x253);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,_error_msg_);
                    goto LAB_0010ac0e;
                  }
                  iVar2 = __isoc99_fscanf(fin," $ARCS {");
                  if (iVar2 == 0) {
                    iVar2 = 0;
                    goto LAB_0010aae7;
                  }
                  snprintf(_error_msg_,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \" $ARCS {\") == 0",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                           ,0x255);
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_00,_error_msg_);
                  goto LAB_0010ac0e;
                }
                if (lVar5 != 0) {
                  iVar2 = __isoc99_fscanf(fin," ,");
                  if (iVar2 != 0) {
                    snprintf(_error_msg_,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \" ,\") == 0",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x24a);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,_error_msg_);
                    goto LAB_0010ac0e;
                  }
                }
                iVar2 = __isoc99_fscanf(fin,"%d",(long)(this->Ts).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start +
                                                 lVar5);
                lVar6 = lVar6 + 1;
                lVar5 = lVar5 + 4;
              } while (iVar2 == 1);
              snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \"%d\", &Ts[i]) == 1",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                       ,0x24b);
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,_error_msg_);
            }
            else {
              snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" $Ts { \") == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                       ,0x248);
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,_error_msg_);
            }
          }
          else {
            snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                     "fscanf(fin, \" $S { %d } ;\", &S) == 1",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                     ,0x245);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,_error_msg_);
          }
        }
        else {
          snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "nbtypes == inst.nbtypes",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                   ,0x243);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,_error_msg_);
        }
      }
      else {
        snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \" $NBTYPES { %d } ;\", &nbtypes) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x242);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,_error_msg_);
      }
    }
    else {
      snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" #GRAPH_BEGIN#\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x23f);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,_error_msg_);
    }
  }
  else {
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x23c);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,_error_msg_);
  }
LAB_0010ac0e:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_0010aae7:
  if (pAVar1->NA <= iVar2) goto LAB_0010ab36;
  iVar3 = __isoc99_fscanf(fin," %d %d %d ",&i_u,&i_v,&label);
  if (iVar3 != 3) {
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" %d %d %d \", &i_u, &i_v, &label) == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,600);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,_error_msg_);
    goto LAB_0010ac0e;
  }
  _error_msg_[0] = (undefined1)i_u;
  _error_msg_[1] = i_u._1_1_;
  _error_msg_[2] = i_u._2_1_;
  _error_msg_[3] = i_u._3_1_;
  _error_msg_[4] = (undefined1)i_v;
  _error_msg_[5] = i_v._1_1_;
  _error_msg_[6] = i_v._2_1_;
  _error_msg_[7] = i_v._3_1_;
  _error_msg_[8] = (undefined1)label;
  _error_msg_[9] = label._1_1_;
  _error_msg_[10] = label._2_1_;
  _error_msg_[0xb] = label._3_1_;
  std::vector<Arc,_std::allocator<Arc>_>::emplace_back<Arc>(&pAVar1->A,(Arc *)_error_msg_);
  iVar2 = iVar2 + 1;
  goto LAB_0010aae7;
LAB_0010ab36:
  iVar2 = __isoc99_fscanf(fin," } ;");
  if (iVar2 == 0) {
    iVar2 = __isoc99_fscanf(fin," #GRAPH_END#");
    if (iVar2 == 0) {
      local_140->ready = true;
      return (ssize_t)local_140;
    }
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" #GRAPH_END#\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x25c);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,_error_msg_);
  }
  else {
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" } ;\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x25b);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,_error_msg_);
  }
  goto LAB_0010ac0e;
}

Assistant:

void Arcflow::read(FILE *fin) {
	throw_assert(ready == false);
	tstart = CURTIME;
	inst = Instance(fin);
	throw_assert(fscanf(fin, " #GRAPH_BEGIN#") == 0);

	int nbtypes;
	throw_assert(fscanf(fin, " $NBTYPES { %d } ;", &nbtypes) == 1);
	throw_assert(nbtypes == inst.nbtypes);

	throw_assert(fscanf(fin, " $S { %d } ;", &S) == 1);

	Ts.resize(nbtypes);
	throw_assert(fscanf(fin, " $Ts { ") == 0);
	for (int i = 0; i < nbtypes; i++) {
		if (i) throw_assert(fscanf(fin, " ,") == 0);
		throw_assert(fscanf(fin, "%d", &Ts[i]) == 1);
	}
	throw_assert(fscanf(fin, " } ;") == 0);

	throw_assert(fscanf(fin, " $LOSS { %d } ;", &LOSS) == 1);

	throw_assert(fscanf(fin, " $NV { %d } ;", &NV) == 1);

	throw_assert(fscanf(fin, " $NA { %d } ;", &NA) == 1);

	throw_assert(fscanf(fin, " $ARCS {") == 0);
	for (int i = 0; i < NA; i++) {
		int i_u, i_v, label;
		throw_assert(fscanf(fin, " %d %d %d ", &i_u, &i_v, &label) == 3);
		A.push_back(Arc(i_u, i_v, label));
	}
	throw_assert(fscanf(fin, " } ;") == 0);
	throw_assert(fscanf(fin, " #GRAPH_END#") == 0);
	ready = true;
}